

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

void __thiscall
gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testInit
          (VaryingExceedingComponentsTest *this)

{
  vector<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase>_>
  *this_00;
  pointer *pptVar1;
  iterator iVar2;
  GLuint GVar3;
  GLuint index;
  VaryingExceedingComponentsTest *this_01;
  GLuint stage;
  STAGES SVar4;
  Type TVar5;
  testCase local_90;
  testCase local_78;
  testCase local_60;
  testCase local_48;
  
  this_00 = &this->m_test_cases;
  index = 0;
  this_01 = this;
  do {
    TVar5 = TestBase::getType((TestBase *)this_01,index);
    GVar3 = 5 - TVar5.m_n_rows;
    SVar4 = COMPUTE;
    do {
      if ((SVar4 != COMPUTE) && ((TVar5._0_8_ & 0xffffffff00000000) == 0x100000000)) {
        local_48.m_is_input = true;
        local_48.m_is_array = true;
        local_48.m_type.m_basic_type = TVar5.m_basic_type;
        local_48.m_type._4_8_ = TVar5._4_8_;
        local_60.m_is_input = true;
        local_60.m_is_array = false;
        local_78.m_is_input = false;
        local_78.m_is_array = true;
        local_90.m_is_input = false;
        local_90.m_is_array = false;
        iVar2._M_current =
             (this->m_test_cases).
             super__Vector_base<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_90.m_component = GVar3;
        local_90.m_stage = SVar4;
        local_90.m_type.m_basic_type = local_48.m_type.m_basic_type;
        local_90.m_type._4_8_ = local_48.m_type._4_8_;
        local_78.m_component = GVar3;
        local_78.m_stage = SVar4;
        local_78.m_type.m_basic_type = local_48.m_type.m_basic_type;
        local_78.m_type._4_8_ = local_48.m_type._4_8_;
        local_60.m_component = GVar3;
        local_60.m_stage = SVar4;
        local_60.m_type.m_basic_type = local_48.m_type.m_basic_type;
        local_60.m_type._4_8_ = local_48.m_type._4_8_;
        local_48.m_component = GVar3;
        local_48.m_stage = SVar4;
        if (iVar2._M_current ==
            (this->m_test_cases).
            super__Vector_base<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          this_01 = (VaryingExceedingComponentsTest *)this_00;
          std::
          vector<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase>>
          ::
          _M_realloc_insert<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase_const&>
                    ((vector<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase>>
                      *)this_00,iVar2,&local_48);
        }
        else {
          ((iVar2._M_current)->m_type).m_n_columns = local_48.m_type.m_n_columns;
          ((iVar2._M_current)->m_type).m_n_rows = local_48.m_type.m_n_rows;
          (iVar2._M_current)->m_component = GVar3;
          (iVar2._M_current)->m_is_input = (bool)(char)0x101;
          (iVar2._M_current)->m_is_array = (bool)(char)(0x101 >> 8);
          *(undefined2 *)&(iVar2._M_current)->field_0x6 = local_48._6_2_;
          (iVar2._M_current)->m_stage = SVar4;
          ((iVar2._M_current)->m_type).m_basic_type = local_48.m_type.m_basic_type;
          pptVar1 = &(this->m_test_cases).
                     super__Vector_base<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *pptVar1 = *pptVar1 + 1;
        }
        iVar2._M_current =
             (this->m_test_cases).
             super__Vector_base<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (this->m_test_cases).
            super__Vector_base<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          this_01 = (VaryingExceedingComponentsTest *)this_00;
          std::
          vector<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase>>
          ::
          _M_realloc_insert<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase_const&>
                    ((vector<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase>>
                      *)this_00,iVar2,&local_60);
        }
        else {
          ((iVar2._M_current)->m_type).m_n_columns = local_60.m_type.m_n_columns;
          ((iVar2._M_current)->m_type).m_n_rows = local_60.m_type.m_n_rows;
          (iVar2._M_current)->m_component = local_60.m_component;
          (iVar2._M_current)->m_is_input = (bool)local_60.m_is_input;
          (iVar2._M_current)->m_is_array = (bool)local_60.m_is_array;
          *(undefined2 *)&(iVar2._M_current)->field_0x6 = local_60._6_2_;
          (iVar2._M_current)->m_stage = local_60.m_stage;
          ((iVar2._M_current)->m_type).m_basic_type = local_60.m_type.m_basic_type;
          pptVar1 = &(this->m_test_cases).
                     super__Vector_base<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *pptVar1 = *pptVar1 + 1;
        }
        if (SVar4 != FRAGMENT) {
          iVar2._M_current =
               (this->m_test_cases).
               super__Vector_base<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (this->m_test_cases).
              super__Vector_base<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            this_01 = (VaryingExceedingComponentsTest *)this_00;
            std::
            vector<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase>>
            ::
            _M_realloc_insert<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase_const&>
                      ((vector<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase>>
                        *)this_00,iVar2,&local_78);
          }
          else {
            ((iVar2._M_current)->m_type).m_n_columns = local_78.m_type.m_n_columns;
            ((iVar2._M_current)->m_type).m_n_rows = local_78.m_type.m_n_rows;
            (iVar2._M_current)->m_component = local_78.m_component;
            (iVar2._M_current)->m_is_input = (bool)local_78.m_is_input;
            (iVar2._M_current)->m_is_array = (bool)local_78.m_is_array;
            *(undefined2 *)&(iVar2._M_current)->field_0x6 = local_78._6_2_;
            (iVar2._M_current)->m_stage = local_78.m_stage;
            ((iVar2._M_current)->m_type).m_basic_type = local_78.m_type.m_basic_type;
            pptVar1 = &(this->m_test_cases).
                       super__Vector_base<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pptVar1 = *pptVar1 + 1;
          }
          iVar2._M_current =
               (this->m_test_cases).
               super__Vector_base<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (this->m_test_cases).
              super__Vector_base<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            this_01 = (VaryingExceedingComponentsTest *)this_00;
            std::
            vector<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase>>
            ::
            _M_realloc_insert<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase_const&>
                      ((vector<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase>>
                        *)this_00,iVar2,&local_90);
          }
          else {
            ((iVar2._M_current)->m_type).m_n_columns = local_90.m_type.m_n_columns;
            ((iVar2._M_current)->m_type).m_n_rows = local_90.m_type.m_n_rows;
            (iVar2._M_current)->m_component = local_90.m_component;
            (iVar2._M_current)->m_is_input = (bool)local_90.m_is_input;
            (iVar2._M_current)->m_is_array = (bool)local_90.m_is_array;
            *(undefined2 *)&(iVar2._M_current)->field_0x6 = local_90._6_2_;
            (iVar2._M_current)->m_stage = local_90.m_stage;
            ((iVar2._M_current)->m_type).m_basic_type = local_90.m_type.m_basic_type;
            pptVar1 = &(this->m_test_cases).
                       super__Vector_base<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pptVar1 = *pptVar1 + 1;
          }
        }
      }
      SVar4 = SVar4 + VERTEX;
    } while (SVar4 != STAGE_MAX);
    index = index + 1;
  } while (index != 0x22);
  return;
}

Assistant:

void VaryingExceedingComponentsTest::testInit()
{
	static const GLuint n_components_per_location = 4;
	const GLuint		n_types					  = getTypesNumber();

	for (GLuint i = 0; i < n_types; ++i)
	{
		const Utils::Type& type				 = getType(i);
		const GLuint	   n_req_components  = type.m_n_rows;
		const GLuint	   valid_component   = n_components_per_location - n_req_components;
		const GLuint	   invalid_component = valid_component + 1;

		for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
		{
			if (Utils::Shader::COMPUTE == stage)
			{
				continue;
			}

			/* Component cannot be used for matrices */
			if (1 != type.m_n_columns)
			{
				continue;
			}

			testCase test_case_in_arr  = { invalid_component, true, true, (Utils::Shader::STAGES)stage, type };
			testCase test_case_in_one  = { invalid_component, true, false, (Utils::Shader::STAGES)stage, type };
			testCase test_case_out_arr = { invalid_component, false, true, (Utils::Shader::STAGES)stage, type };
			testCase test_case_out_one = { invalid_component, false, false, (Utils::Shader::STAGES)stage, type };

			m_test_cases.push_back(test_case_in_arr);
			m_test_cases.push_back(test_case_in_one);

			if (Utils::Shader::FRAGMENT != stage)
			{
				m_test_cases.push_back(test_case_out_arr);
				m_test_cases.push_back(test_case_out_one);
			}
		}
	}
}